

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.c
# Opt level: O0

size_t cmsysBase64_Decode(uchar *input,size_t length,uchar *output,size_t max_input_length)

{
  int iVar1;
  uchar local_67 [3];
  int len_3;
  uchar temp_1 [3];
  int len_2;
  uchar temp [3];
  int len_1;
  uchar *oend;
  int len;
  uchar *end;
  uchar *optr;
  uchar *ptr;
  size_t max_input_length_local;
  uchar *output_local;
  size_t length_local;
  uchar *input_local;
  
  end = output;
  optr = input;
  if (max_input_length == 0) {
    while (2 < (long)(output + (length - (long)end))) {
      iVar1 = cmsysBase64_Decode3(optr,end);
      end = end + iVar1;
      if (iVar1 < 3) {
        return (size_t)(end + -(long)output);
      }
      optr = optr + 4;
    }
    if (output + (length - (long)end) == (uchar *)0x2) {
      iVar1 = cmsysBase64_Decode3(optr,temp_1);
      if (iVar1 < 2) {
        if (0 < iVar1) {
          *end = temp_1[0];
          end = end + 1;
        }
      }
      else {
        *end = temp_1[0];
        end[1] = temp_1[1];
        end = end + 2;
      }
    }
    else if ((output + (length - (long)end) == (uchar *)0x1) &&
            (iVar1 = cmsysBase64_Decode3(optr,local_67), 0 < iVar1)) {
      *end = local_67[0];
      end = end + 1;
    }
  }
  else {
    for (; optr < input + max_input_length; optr = optr + 4) {
      iVar1 = cmsysBase64_Decode3(optr,end);
      end = end + iVar1;
      if (iVar1 < 3) {
        return (size_t)(end + -(long)output);
      }
    }
  }
  return (size_t)(end + -(long)output);
}

Assistant:

size_t kwsysBase64_Decode(const unsigned char* input, size_t length,
                          unsigned char* output, size_t max_input_length)
{
  const unsigned char* ptr = input;
  unsigned char* optr = output;

  /* Decode complete triplet */

  if (max_input_length) {
    const unsigned char* end = input + max_input_length;
    while (ptr < end) {
      int len = kwsysBase64_Decode3(ptr, optr);
      optr += len;
      if (len < 3) {
        return (size_t)(optr - output);
      }
      ptr += 4;
    }
  } else {
    unsigned char* oend = output + length;
    while ((oend - optr) >= 3) {
      int len = kwsysBase64_Decode3(ptr, optr);
      optr += len;
      if (len < 3) {
        return (size_t)(optr - output);
      }
      ptr += 4;
    }

    /* Decode the last triplet */

    if (oend - optr == 2) {
      unsigned char temp[3];
      int len = kwsysBase64_Decode3(ptr, temp);
      if (len >= 2) {
        optr[0] = temp[0];
        optr[1] = temp[1];
        optr += 2;
      } else if (len > 0) {
        optr[0] = temp[0];
        optr += 1;
      }
    } else if (oend - optr == 1) {
      unsigned char temp[3];
      int len = kwsysBase64_Decode3(ptr, temp);
      if (len > 0) {
        optr[0] = temp[0];
        optr += 1;
      }
    }
  }

  return (size_t)(optr - output);
}